

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O3

void ScaleCols_C(uint8_t *dst_ptr,uint8_t *src_ptr,int dst_width,int x,int dx)

{
  long lVar1;
  
  if (1 < dst_width) {
    lVar1 = 0;
    do {
      dst_ptr[lVar1] = src_ptr[x >> 0x10];
      dst_ptr[lVar1 + 1] = src_ptr[x + dx >> 0x10];
      x = x + dx + dx;
      lVar1 = lVar1 + 2;
    } while ((int)lVar1 < dst_width + -1);
    dst_ptr = dst_ptr + lVar1;
  }
  if ((dst_width & 1U) != 0) {
    *dst_ptr = src_ptr[x >> 0x10];
  }
  return;
}

Assistant:

void ScaleCols_C(uint8_t* dst_ptr,
                 const uint8_t* src_ptr,
                 int dst_width,
                 int x,
                 int dx) {
  int j;
  for (j = 0; j < dst_width - 1; j += 2) {
    dst_ptr[0] = src_ptr[x >> 16];
    x += dx;
    dst_ptr[1] = src_ptr[x >> 16];
    x += dx;
    dst_ptr += 2;
  }
  if (dst_width & 1) {
    dst_ptr[0] = src_ptr[x >> 16];
  }
}